

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O2

S2Point * __thiscall
S2::PlateCarreeProjection::Unproject
          (S2Point *__return_storage_ptr__,PlateCarreeProjection *this,R2Point *p)

{
  R2Point local_18;
  
  local_18.c_ = (VType  [2])ToLatLng(this,p);
  S2LatLng::ToPoint(__return_storage_ptr__,(S2LatLng *)&local_18);
  return __return_storage_ptr__;
}

Assistant:

S2Point PlateCarreeProjection::Unproject(const R2Point& p) const {
  return ToLatLng(p).ToPoint();
}